

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepEdge.hxx
# Opt level: O1

Unique<BrepEdge> __thiscall anurbs::BrepEdge::load(BrepEdge *this,Model *model,Json *data)

{
  undefined8 *puVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pRVar5;
  const_reference pvVar6;
  ulong uVar7;
  size_type __new_size;
  long lVar8;
  ulong idx;
  value_type trims;
  string key;
  undefined1 local_a0 [8];
  json_value local_98;
  tuple<anurbs::BrepEdge_*,_std::default_delete<anurbs::BrepEdge>_> local_90;
  key_type local_88;
  pointer local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  pointer *local_50 [2];
  pointer local_40 [2];
  
  pRVar5 = (pointer)operator_new(0x18);
  (pRVar5->m_entry).super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(pRVar5->m_entry).
          super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> + 8))->
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pRVar5[1].m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = 0;
  (this->m_trims).
  super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pRVar5;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_90.super__Tuple_impl<0UL,_anurbs::BrepEdge_*,_std::default_delete<anurbs::BrepEdge>_>.
  super__Head_base<0UL,_anurbs::BrepEdge_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_anurbs::BrepEdge_*,_std::default_delete<anurbs::BrepEdge>_>)
       (_Tuple_impl<0UL,_anurbs::BrepEdge_*,_std::default_delete<anurbs::BrepEdge>_>)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"trims","");
  pvVar6 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(data,&local_88);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_a0,pvVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  __new_size = (size_type)local_a0[0];
  if (local_a0[0] != null) {
    if (local_a0[0] == object) {
      __new_size = ((local_98.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    else if (local_a0[0] == array) {
      __new_size = (long)(((local_98.object)->m_keys)._M_h._M_bucket_count -
                         (long)((local_98.object)->m_keys)._M_h._M_buckets) >> 4;
    }
    else {
      __new_size = 1;
    }
  }
  std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
  resize((vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_> *)
         (((vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_> *
           )local_90.
            super__Tuple_impl<0UL,_anurbs::BrepEdge_*,_std::default_delete<anurbs::BrepEdge>_>.
            super__Head_base<0UL,_anurbs::BrepEdge_*,_false>._M_head_impl)->
         super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
         )._M_impl.super__Vector_impl_data._M_start,__new_size);
  lVar8 = 8;
  idx = 0;
  while( true ) {
    uVar7 = (ulong)local_a0[0];
    if (local_a0[0] != null) {
      if (local_a0[0] == object) {
        uVar7 = ((local_98.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      else if (local_a0[0] == array) {
        uVar7 = (long)(((local_98.object)->m_keys)._M_h._M_bucket_count -
                      (long)((local_98.object)->m_keys)._M_h._M_buckets) >> 4;
      }
      else {
        uVar7 = 1;
      }
    }
    if (uVar7 <= idx) break;
    pvVar6 = nlohmann::
             basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[]((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_a0,idx);
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_88,pvVar6);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    Model::get_lazy<anurbs::BrepTrim>((Model *)&local_68,(string *)model);
    p_Var4 = p_Stack_60;
    psVar3 = local_68;
    lVar2 = *(long *)&(((((vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
                           *)local_90.
                             super__Tuple_impl<0UL,_anurbs::BrepEdge_*,_std::default_delete<anurbs::BrepEdge>_>
                             .super__Head_base<0UL,_anurbs::BrepEdge_*,_false>._M_head_impl)->
                        super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->m_entry).
                      super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>
    ;
    local_68 = (pointer)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + lVar8);
    puVar1 = (undefined8 *)(lVar2 + -8 + lVar8);
    *puVar1 = psVar3;
    puVar1[1] = p_Var4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],(long)local_40[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    idx = idx + 1;
    lVar8 = lVar8 + 0x10;
  }
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_a0);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_a0 + 8),local_a0[0]);
  return (__uniq_ptr_data<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>,_true,_true>)
         (tuple<anurbs::BrepEdge_*,_std::default_delete<anurbs::BrepEdge>_>)
         local_90.super__Tuple_impl<0UL,_anurbs::BrepEdge_*,_std::default_delete<anurbs::BrepEdge>_>
         .super__Head_base<0UL,_anurbs::BrepEdge_*,_false>._M_head_impl;
}

Assistant:

Unique<BrepEdge> BrepEdge::load(Model& model, const Json& data)
{
    auto result = new_<BrepEdge>();

    // Read trims
    {
        const auto trims = data.at("trims");

        result->m_trims.resize(trims.size());

        for (size_t i = 0; i < trims.size(); i++) {
            const std::string key = trims[i];
            result->m_trims[i] = model.get_lazy<BrepTrim>(key);
        }
    }

    return result;
}